

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O0

aiMaterial * __thiscall Assimp::IrrlichtBase::ParseMaterial(IrrlichtBase *this,uint *matFlags)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  aiMaterial *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar4;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Logger *pLVar5;
  uint local_554;
  uint local_550;
  int op;
  uint unmasked;
  float f;
  int map_3;
  int map_2;
  int map_1;
  int map;
  undefined1 local_518 [8];
  StringProperty prop_3;
  int local_4d0;
  int val_2;
  int val_1;
  int val;
  BoolProperty prop_2;
  FloatProperty prop_1;
  HexProperty prop;
  uint nd;
  int cnt;
  aiString s;
  aiColor4D clr;
  aiMaterial *mat;
  uint *matFlags_local;
  IrrlichtBase *this_local;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)(s.data + 0x3f8));
  aiString::aiString((aiString *)&nd);
  *matFlags = 0;
  prop._36_4_ = 0;
  prop.value = 0;
LAB_0069955a:
  do {
    while( true ) {
      uVar2 = (*this->reader->_vptr_IIrrXMLReader[2])();
      if ((uVar2 & 1) == 0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,"IRRMESH: Unexpected end of file. Material is not complete");
        return this_00;
      }
      iVar3 = (*this->reader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) break;
      if (iVar3 == 2) {
        iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_04,iVar3),"material");
        if (iVar3 == 0) goto LAB_0069a55c;
        iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_05,iVar3),"attributes");
        if (iVar3 == 0) {
LAB_0069a55c:
          if ((prop._36_4_ != 0) && ((*matFlags & 2) != 0)) {
            op = 0x3f800000;
            uVar2 = *matFlags;
            local_550 = uVar2 & 0xfffffffd;
            local_554 = (uint)((uVar2 & 0x80) != 0);
            if (((uVar2 & 4) == 0) && ((uVar2 & 0x20) == 0)) {
              if (((uVar2 & 8) != 0) || ((uVar2 & 0x40) != 0)) {
                op = 0x40800000;
              }
            }
            else {
              op = 0x40000000;
            }
            aiMaterial::AddProperty(this_00,(float *)&op,1,"$tex.blend",10,0);
            aiMaterial::AddProperty(this_00,(int *)&local_554,1,"$tex.op",10,0);
          }
          return this_00;
        }
      }
    }
    iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar3),"color");
    if (iVar3 == 0) {
      Property<unsigned_int>::Property((Property<unsigned_int> *)&prop_1.value);
      ReadHexProperty(this,(HexProperty *)&prop_1.value);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &prop_1.value,"Diffuse");
      if (bVar1) {
        ColorFromARGBPacked(prop.name.field_2._8_4_,(aiColor4D *)(s.data + 0x3f8));
        aiMaterial::AddProperty(this_00,(aiColor4D *)(s.data + 0x3f8),1,"$clr.diffuse",0,0);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&prop_1.value,"Ambient");
        if (bVar1) {
          ColorFromARGBPacked(prop.name.field_2._8_4_,(aiColor4D *)(s.data + 0x3f8));
          aiMaterial::AddProperty(this_00,(aiColor4D *)(s.data + 0x3f8),1,"$clr.ambient",0,0);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&prop_1.value,"Specular");
          if (bVar1) {
            ColorFromARGBPacked(prop.name.field_2._8_4_,(aiColor4D *)(s.data + 0x3f8));
            aiMaterial::AddProperty(this_00,(aiColor4D *)(s.data + 0x3f8),1,"$clr.specular",0,0);
          }
        }
      }
      Property<unsigned_int>::~Property((Property<unsigned_int> *)&prop_1.value);
      goto LAB_0069955a;
    }
    iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_00,iVar3),"float");
    if (iVar3 != 0) {
      iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_01,iVar3),"bool");
      if (iVar3 != 0) {
        iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_02,iVar3),"texture");
        if (iVar3 != 0) {
          iVar3 = (*this->reader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_03,iVar3),"enum");
          if (iVar3 != 0) goto LAB_0069955a;
        }
        Property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        Property((Property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_518);
        ReadStringProperty(this,(Property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_518);
        lVar4 = std::__cxx11::string::length();
        if (lVar4 != 0) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_518,"Type");
          if ((bVar1) &&
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&prop_3.name.field_2 + 8),"solid"), !bVar1)) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&prop_3.name.field_2 + 8),"trans_vertex_alpha");
            if (bVar1) {
              *matFlags = 1;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&prop_3.name.field_2 + 8),"lightmap");
              if (bVar1) {
                *matFlags = 2;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&prop_3.name.field_2 + 8),"solid_2layer");
                if (bVar1) {
                  *matFlags = 0x10000;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&prop_3.name.field_2 + 8),"lightmap_m2");
                  if (bVar1) {
                    *matFlags = 6;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&prop_3.name.field_2 + 8),"lightmap_m4");
                    if (bVar1) {
                      *matFlags = 10;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&prop_3.name.field_2 + 8),"lightmap_light");
                      if (bVar1) {
                        *matFlags = 0x12;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)&prop_3.name.field_2 + 8),
                                                "lightmap_light_m2");
                        if (bVar1) {
                          *matFlags = 0x22;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8),
                                                  "lightmap_light_m4");
                          if (bVar1) {
                            *matFlags = 0x42;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8),"lightmap_add")
                            ;
                            if (bVar1) {
                              *matFlags = 0x82;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8),
                                                  "normalmap_solid");
                              if ((bVar1) ||
                                 (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8),
                                                  "parallaxmap_solid"), bVar1)) {
                                *matFlags = 0x100;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8),
                                                  "normalmap_trans_vertex_alpha");
                                if ((bVar1) ||
                                   (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8),
                                                  "parallaxmap_trans_vertex_alpha"), bVar1)) {
                                  *matFlags = 0x101;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8),
                                                  "normalmap_trans_add");
                                  if ((bVar1) ||
                                     (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8),
                                                  "parallaxmap_trans_add"), bVar1)) {
                                    *matFlags = 0x102;
                                  }
                                  else {
                                    pLVar5 = DefaultLogger::get();
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&map_1,"IRRMat: Unrecognized material type: ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prop_3.name.field_2 + 8));
                                    Logger::warn(pLVar5,(string *)&map_1);
                                    std::__cxx11::string::~string((string *)&map_1);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_518,"Texture1");
          if (bVar1) {
            prop._36_4_ = prop._36_4_ + 1;
            aiString::Set((aiString *)&nd,(string *)((long)&prop_3.name.field_2 + 8));
            aiMaterial::AddProperty(this_00,(aiString *)&nd,"$tex.file",1,0);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_518,"Texture2");
            if ((bVar1) && (prop._36_4_ == 1)) {
              if ((*matFlags & 2) == 0) {
                if ((*matFlags & 0x100) == 0) {
                  if ((*matFlags & 0x10000) == 0) {
                    pLVar5 = DefaultLogger::get();
                    Logger::warn(pLVar5,"IRRmat: Skipping second texture");
                  }
                  else {
                    prop._36_4_ = 2;
                    aiString::Set((aiString *)&nd,(string *)((long)&prop_3.name.field_2 + 8));
                    aiMaterial::AddProperty(this_00,(aiString *)&nd,"$tex.file",1,1);
                    prop.value = prop.value + 1;
                    *matFlags = *matFlags | 0x100000;
                  }
                }
                else {
                  prop._36_4_ = 2;
                  aiString::Set((aiString *)&nd,(string *)((long)&prop_3.name.field_2 + 8));
                  aiMaterial::AddProperty(this_00,(aiString *)&nd,"$tex.file",6,0);
                  *matFlags = *matFlags | 0x100000;
                }
              }
              else {
                prop._36_4_ = 2;
                aiString::Set((aiString *)&nd,(string *)((long)&prop_3.name.field_2 + 8));
                aiMaterial::AddProperty(this_00,(aiString *)&nd,"$tex.file",10,0);
                *matFlags = *matFlags | 0x100000;
              }
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_518,"Texture3");
              if ((bVar1) && (prop._36_4_ == 2)) {
                prop._36_4_ = 3;
                aiString::Set((aiString *)&nd,(string *)((long)&prop_3.name.field_2 + 8));
                aiMaterial::AddProperty(this_00,(aiString *)&nd,"$tex.file",1,prop.value + 1);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_518,"Texture4");
                if ((bVar1) && (prop._36_4_ == 3)) {
                  prop._36_4_ = 4;
                  aiString::Set((aiString *)&nd,(string *)((long)&prop_3.name.field_2 + 8));
                  aiMaterial::AddProperty(this_00,(aiString *)&nd,"$tex.file",1,prop.value + 2);
                }
              }
            }
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_518,"TextureWrap1");
          if ((bVar1) && (0 < (int)prop._36_4_)) {
            map_2 = ConvertMappingMode((string *)((long)&prop_3.name.field_2 + 8));
            aiMaterial::AddProperty(this_00,&map_2,1,"$tex.mapmodeu",1,0);
            aiMaterial::AddProperty(this_00,&map_2,1,"$tex.mapmodev",1,0);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_518,"TextureWrap2");
            if ((bVar1) && (1 < (int)prop._36_4_)) {
              map_3 = ConvertMappingMode((string *)((long)&prop_3.name.field_2 + 8));
              if ((*matFlags & 2) == 0) {
                if ((*matFlags & 0x100) == 0) {
                  if ((*matFlags & 0x10000) != 0) {
                    aiMaterial::AddProperty(this_00,&map_3,1,"$tex.mapmodeu",1,1);
                    aiMaterial::AddProperty(this_00,&map_3,1,"$tex.mapmodev",1,1);
                  }
                }
                else {
                  aiMaterial::AddProperty(this_00,&map_3,1,"$tex.mapmodeu",6,0);
                  aiMaterial::AddProperty(this_00,&map_3,1,"$tex.mapmodev",6,0);
                }
              }
              else {
                aiMaterial::AddProperty(this_00,&map_3,1,"$tex.mapmodeu",10,0);
                aiMaterial::AddProperty(this_00,&map_3,1,"$tex.mapmodev",10,0);
              }
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_518,"TextureWrap3");
              if ((bVar1) && (2 < (int)prop._36_4_)) {
                f = (float)ConvertMappingMode((string *)((long)&prop_3.name.field_2 + 8));
                aiMaterial::AddProperty(this_00,(int *)&f,1,"$tex.mapmodeu",1,prop.value + 1);
                aiMaterial::AddProperty(this_00,(int *)&f,1,"$tex.mapmodev",1,prop.value + 1);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_518,"TextureWrap4");
                if ((bVar1) && (3 < (int)prop._36_4_)) {
                  unmasked = ConvertMappingMode((string *)((long)&prop_3.name.field_2 + 8));
                  aiMaterial::AddProperty
                            (this_00,(int *)&unmasked,1,"$tex.mapmodeu",1,prop.value + 2);
                  aiMaterial::AddProperty
                            (this_00,(int *)&unmasked,1,"$tex.mapmodev",1,prop.value + 2);
                }
              }
            }
          }
        }
        Property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~Property((Property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_518);
        goto LAB_0069955a;
      }
      Property<bool>::Property((Property<bool> *)&val_1);
      ReadBoolProperty(this,(Property<bool> *)&val_1);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &val_1,"Wireframe");
      if (bVar1) {
        val_2 = (byte)prop_2.name.field_2._M_local_buf[8] & 1;
        aiMaterial::AddProperty(this_00,&val_2,1,"$mat.wireframe",0,0);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&val_1,"GouraudShading");
        if (bVar1) {
          local_4d0 = 9;
          if ((prop_2.name.field_2._M_local_buf[8] & 1U) != 0) {
            local_4d0 = 2;
          }
          aiMaterial::AddProperty(this_00,&local_4d0,1,"$mat.shadingm",0,0);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&val_1,"BackfaceCulling");
          if (bVar1) {
            prop_3.value.field_2._12_4_ = (byte)~prop_2.name.field_2._M_local_buf[8] & 1;
            aiMaterial::AddProperty
                      (this_00,(int *)(prop_3.value.field_2._M_local_buf + 0xc),1,"$mat.twosided",0,
                       0);
          }
        }
      }
      Property<bool>::~Property((Property<bool> *)&val_1);
      goto LAB_0069955a;
    }
    Property<float>::Property((Property<float> *)&prop_2.value);
    ReadFloatProperty(this,(FloatProperty *)&prop_2.value);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &prop_2.value,"Shininess");
    if (bVar1) {
      aiMaterial::AddProperty
                (this_00,(float *)((long)&prop_1.name.field_2 + 8),1,"$mat.shininess",0,0);
    }
    Property<float>::~Property((Property<float> *)&prop_2.value);
  } while( true );
}

Assistant:

aiMaterial* IrrlichtBase::ParseMaterial(unsigned int& matFlags)
{
    aiMaterial* mat = new aiMaterial();
    aiColor4D clr;
    aiString s;

    matFlags = 0; // zero output flags
    int cnt  = 0; // number of used texture channels
    unsigned int nd = 0;

    // Continue reading from the file
    while (reader->read())
    {
        switch (reader->getNodeType())
        {
        case EXN_ELEMENT:

            // Hex properties
            if (!ASSIMP_stricmp(reader->getNodeName(),"color"))
            {
                HexProperty prop;
                ReadHexProperty(prop);
                if (prop.name == "Diffuse")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
                }
                else if (prop.name == "Ambient")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_AMBIENT);
                }
                else if (prop.name == "Specular")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_SPECULAR);
                }

                // NOTE: The 'emissive' property causes problems. It is
                // often != 0, even if there is obviously no light
                // emitted by the described surface. In fact I think
                // IRRLICHT ignores this property, too.
#if 0
                else if (prop.name == "Emissive")
                {
                    ColorFromARGBPacked(prop.value,clr);
                    mat->AddProperty(&clr,1,AI_MATKEY_COLOR_EMISSIVE);
                }
#endif
            }
            // Float properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"float"))
            {
                FloatProperty prop;
                ReadFloatProperty(prop);
                if (prop.name == "Shininess")
                {
                    mat->AddProperty(&prop.value,1,AI_MATKEY_SHININESS);
                }
            }
            // Bool properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"bool"))
            {
                BoolProperty prop;
                ReadBoolProperty(prop);
                if (prop.name == "Wireframe")
                {
                    int val = (prop.value ? true : false);
                    mat->AddProperty(&val,1,AI_MATKEY_ENABLE_WIREFRAME);
                }
                else if (prop.name == "GouraudShading")
                {
                    int val = (prop.value ? aiShadingMode_Gouraud
                        : aiShadingMode_NoShading);
                    mat->AddProperty(&val,1,AI_MATKEY_SHADING_MODEL);
                }
                else if (prop.name == "BackfaceCulling")
                {
                    int val = (!prop.value);
                    mat->AddProperty(&val,1,AI_MATKEY_TWOSIDED);
                }
            }
            // String properties - textures and texture related properties
            else if (!ASSIMP_stricmp(reader->getNodeName(),"texture") ||
                     !ASSIMP_stricmp(reader->getNodeName(),"enum"))
            {
                StringProperty prop;
                ReadStringProperty(prop);
                if (prop.value.length())
                {
                    // material type (shader)
                    if (prop.name == "Type")
                    {
                        if (prop.value == "solid")
                        {
                            // default material ...
                        }
                        else if (prop.value == "trans_vertex_alpha")
                        {
                            matFlags = AI_IRRMESH_MAT_trans_vertex_alpha;
                        }
                        else if (prop.value == "lightmap")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap;
                        }
                        else if (prop.value == "solid_2layer")
                        {
                            matFlags = AI_IRRMESH_MAT_solid_2layer;
                        }
                        else if (prop.value == "lightmap_m2")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_m2;
                        }
                        else if (prop.value == "lightmap_m4")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_m4;
                        }
                        else if (prop.value == "lightmap_light")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light;
                        }
                        else if (prop.value == "lightmap_light_m2")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light_m2;
                        }
                        else if (prop.value == "lightmap_light_m4")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_light_m4;
                        }
                        else if (prop.value == "lightmap_add")
                        {
                            matFlags = AI_IRRMESH_MAT_lightmap_add;
                        }
                        // Normal and parallax maps are treated equally
                        else if (prop.value == "normalmap_solid" ||
                            prop.value == "parallaxmap_solid")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_solid;
                        }
                        else if (prop.value == "normalmap_trans_vertex_alpha" ||
                            prop.value == "parallaxmap_trans_vertex_alpha")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_tva;
                        }
                        else if (prop.value == "normalmap_trans_add" ||
                            prop.value == "parallaxmap_trans_add")
                        {
                            matFlags = AI_IRRMESH_MAT_normalmap_ta;
                        }
                        else {
                            ASSIMP_LOG_WARN("IRRMat: Unrecognized material type: " + prop.value);
                        }
                    }

                    // Up to 4 texture channels are supported
                    if (prop.name == "Texture1")
                    {
                        // Always accept the primary texture channel
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
                    }
                    else if (prop.name == "Texture2" && cnt == 1)
                    {
                        // 2-layer material lightmapped?
                        if (matFlags & AI_IRRMESH_MAT_lightmap) {
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_LIGHTMAP(0));

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        }
                        // alternatively: normal or parallax mapping
                        else if (matFlags & AI_IRRMESH_MAT_normalmap_solid) {
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_NORMALS(0));

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        } else if (matFlags & AI_IRRMESH_MAT_solid_2layer)    {// or just as second diffuse texture
                            ++cnt;
                            s.Set(prop.value);
                            mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(1));
                            ++nd;

                            // set the corresponding material flag
                            matFlags |= AI_IRRMESH_EXTRA_2ND_TEXTURE;
                        } else {
                            ASSIMP_LOG_WARN("IRRmat: Skipping second texture");
                        }
                    } else if (prop.name == "Texture3" && cnt == 2) {
                        // Irrlicht does not seem to use these channels.
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(nd+1));
                    } else if (prop.name == "Texture4" && cnt == 3) {
                        // Irrlicht does not seem to use these channels.
                        ++cnt;
                        s.Set(prop.value);
                        mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(nd+2));
                    }

                    // Texture mapping options
                    if (prop.name == "TextureWrap1" && cnt >= 1)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
                    }
                    else if (prop.name == "TextureWrap2" && cnt >= 2)
                    {
                        int map = ConvertMappingMode(prop.value);
                        if (matFlags & AI_IRRMESH_MAT_lightmap) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_LIGHTMAP(0));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_LIGHTMAP(0));
                        }
                        else if (matFlags & (AI_IRRMESH_MAT_normalmap_solid)) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_NORMALS(0));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_NORMALS(0));
                        }
                        else if (matFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(1));
                            mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(1));
                        }
                    }
                    else if (prop.name == "TextureWrap3" && cnt >= 3)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(nd+1));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(nd+1));
                    }
                    else if (prop.name == "TextureWrap4" && cnt >= 4)
                    {
                        int map = ConvertMappingMode(prop.value);
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(nd+2));
                        mat->AddProperty(&map,1,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(nd+2));
                    }
                }
            }
            break;
            case EXN_ELEMENT_END:

                /* Assume there are no further nested nodes in <material> elements
                 */
                if (/* IRRMESH */ !ASSIMP_stricmp(reader->getNodeName(),"material") ||
                    /* IRR     */ !ASSIMP_stricmp(reader->getNodeName(),"attributes"))
                {
                    // Now process lightmapping flags
                    // We should have at least one textur to do that ..
                    if (cnt && matFlags & AI_IRRMESH_MAT_lightmap)
                    {
                        float f = 1.f;
                        unsigned int unmasked = matFlags&~AI_IRRMESH_MAT_lightmap;

                        // Additive lightmap?
                        int op = (unmasked & AI_IRRMESH_MAT_lightmap_add
                            ? aiTextureOp_Add : aiTextureOp_Multiply);

                        // Handle Irrlicht's lightmapping scaling factor
                        if (unmasked & AI_IRRMESH_MAT_lightmap_m2 ||
                            unmasked & AI_IRRMESH_MAT_lightmap_light_m2)
                        {
                            f = 2.f;
                        }
                        else if (unmasked & AI_IRRMESH_MAT_lightmap_m4 ||
                            unmasked & AI_IRRMESH_MAT_lightmap_light_m4)
                        {
                            f = 4.f;
                        }
                        mat->AddProperty( &f, 1, AI_MATKEY_TEXBLEND_LIGHTMAP(0));
                        mat->AddProperty( &op,1, AI_MATKEY_TEXOP_LIGHTMAP(0));
                    }

                    return mat;
                }
            default:

                // GCC complains here ...
                break;
        }
    }
    ASSIMP_LOG_ERROR("IRRMESH: Unexpected end of file. Material is not complete");

    return mat;
}